

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProblemFireFighting.cpp
# Opt level: O2

size_t __thiscall
ProblemFireFighting::NumberOfContainedStartPositions
          (ProblemFireFighting *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *state)

{
  uint uVar1;
  const_reference pvVar2;
  size_t sVar3;
  
  if (this->_m_includePositions == true) {
    sVar3 = 0;
    for (uVar1 = *(uint *)&(this->super_DecPOMDPDiscrete).field_0x228;
        (ulong)uVar1 < this->_m_nrStateFeatures; uVar1 = uVar1 + 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at(state,(ulong)uVar1);
      sVar3 = sVar3 + (*(ulong *)&(this->super_DecPOMDPDiscrete).field_0x228 == (ulong)*pvVar2);
    }
  }
  else {
    sVar3 = 0;
  }
  return sVar3;
}

Assistant:

size_t ProblemFireFighting::
NumberOfContainedStartPositions(const vector<Index>& state) 
    const
{
    if(!_m_includePositions)
        return(0);

    size_t nrSPs = 0;
    //loop over the position features:
    for(Index i = _m_nrHouses; i < _m_nrStateFeatures; i++)
        if(state.at(i) == _m_nrHouses) //the 'start' postion index = nrHouses
            nrSPs++;
    return nrSPs;
    
}